

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O3

long __thiscall PFData::getPointOffset(PFData *this,int z,int y,int x)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int size;
  int iVar12;
  int iVar13;
  int iVar14;
  int size_1;
  int iVar15;
  int iVar16;
  int iVar17;
  
  iVar5 = this->m_r;
  uVar2 = this->m_nz / iVar5;
  iVar12 = this->m_nz % iVar5;
  iVar8 = (uVar2 + 1) * iVar12;
  if (z < iVar8) {
    iVar12 = z / (int)(uVar2 + 1);
  }
  else {
    iVar12 = (z - iVar8) / (int)uVar2 + iVar12;
  }
  iVar8 = this->m_q;
  iVar13 = this->m_ny % iVar8;
  iVar1 = this->m_p;
  uVar3 = this->m_ny / iVar1;
  iVar9 = (uVar3 + 1) * iVar13;
  if (y < iVar9) {
    iVar9 = y / (int)(uVar3 + 1);
  }
  else {
    iVar9 = (y - iVar9) / (int)uVar3 + iVar13;
  }
  iVar11 = this->m_nx;
  uVar4 = iVar11 / iVar1;
  iVar15 = iVar11 % iVar1;
  iVar10 = (uVar4 + 1) * iVar15;
  if (x < iVar10) {
    iVar10 = x / (int)(uVar4 + 1);
  }
  else {
    iVar10 = (x - iVar10) / (int)uVar4 + iVar15;
  }
  iVar7 = (iVar15 - iVar10) * uVar4;
  iVar16 = iVar15;
  if (iVar10 <= iVar15) {
    iVar16 = iVar10;
  }
  if (iVar10 < iVar15) {
    iVar7 = 0;
  }
  iVar14 = iVar13;
  if (iVar9 <= iVar13) {
    iVar14 = iVar9;
  }
  iVar17 = (iVar13 - iVar9) * uVar3;
  if (iVar9 < iVar13) {
    iVar17 = 0;
  }
  iVar11 = iVar11 % iVar5;
  iVar5 = (iVar11 - iVar12) * uVar2;
  if (iVar12 < iVar11) {
    iVar5 = 0;
  }
  if (iVar12 <= iVar11) {
    iVar11 = iVar12;
  }
  lVar6 = getSubgridOffsetElements(this,iVar12,iVar9,iVar10);
  return (long)(((iVar8 * iVar12 + iVar9) * iVar1 + iVar10) * 0x24) + lVar6 * 8 +
         (long)(int)((~uVar4 * iVar16 + x + iVar7 +
                     (~uVar3 * iVar14 + y + iVar17 +
                     ((iVar9 < iVar13) + uVar3) * (iVar11 * ~uVar2 + z + iVar5)) *
                     ((iVar10 < iVar15) + uVar4)) * 8) + 100;
}

Assistant:

long PFData::getPointOffset(int z, int y, int x) const{
    const int gridZ = getSubgridIndexZ(z);
    const int gridY = getSubgridIndexY(y);
    const int gridX = getSubgridIndexX(x);

    const int remZ = z - getSubgridStartZ(gridZ);
    const int remY = y - getSubgridStartY(gridY);
    const int remX = x - getSubgridStartX(gridX);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const long subgridOffset = getSubgridOffset(gridZ, gridY, gridX) + 36;  //Skip header
    const long pointOffset = 8 * ((remZ * sizeY * sizeX) + (remY * sizeX) + remX);
    return subgridOffset + pointOffset;
}